

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

void __thiscall
wabt::AST::Block<(wabt::ExprType)8>(AST *this,BlockExprBase<(wabt::ExprType)8> *be,LabelType label)

{
  Index nresults;
  Index nparams;
  LabelType label_local;
  BlockExprBase<(wabt::ExprType)8> *be_local;
  AST *this_local;
  
  ModuleContext::BeginBlock(this->mc,label,&be->block);
  nresults = FuncDeclaration::GetNumResults(&(be->block).decl);
  nparams = FuncDeclaration::GetNumParams(&(be->block).decl);
  Construct(this,&(be->block).exprs,nresults,nparams,false);
  ModuleContext::EndBlock(this->mc);
  InsertNode(this,Expr,Block,(Expr *)be,1);
  return;
}

Assistant:

void Block(const BlockExprBase<T>& be, LabelType label) {
    mc.BeginBlock(label, be.block);
    Construct(be.block.exprs, be.block.decl.GetNumResults(),
              be.block.decl.GetNumParams(), false);
    mc.EndBlock();
    InsertNode(NodeType::Expr, T, &be, 1);
  }